

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O0

void __thiscall
vkt::QueryPool::anon_unknown_0::
QueryPoolStatisticsTest<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsSecondaryTestInstance>
::~QueryPoolStatisticsTest
          (QueryPoolStatisticsTest<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsSecondaryTestInstance>
           *this)

{
  QueryPoolStatisticsTest<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsSecondaryTestInstance>
  *this_local;
  
  ~QueryPoolStatisticsTest(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

QueryPoolStatisticsTest (tcu::TestContext &context, const char *name, const char *description)
		: TestCase			(context, name, description)
	{
		const tcu::UVec3	localSize[]		=
		{
			tcu::UVec3	(2u,			2u,	2u),
			tcu::UVec3	(1u,			1u,	1u),
			tcu::UVec3	(WIDTH/(7u*3u),	7u,	3u),
		};

		const tcu::UVec3	groupSize[]		=
		{
			tcu::UVec3	(2u,			2u,	2u),
			tcu::UVec3	(WIDTH/(7u*3u),	7u,	3u),
			tcu::UVec3	(1u,			1u,	1u),
		};

		DE_ASSERT(DE_LENGTH_OF_ARRAY(localSize) == DE_LENGTH_OF_ARRAY(groupSize));

		for(int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(localSize); ++shaderNdx)
		{
			std::ostringstream	shaderName;
			shaderName<< "compute_" << shaderNdx;
			const ComputeInvocationsTestInstance::ParametersCompute	prameters	=
			{
				localSize[shaderNdx],
				groupSize[shaderNdx],
				shaderName.str(),
			};
			m_parameters.push_back(prameters);
		}
	}